

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O2

void __thiscall ArgParser::initOptions(ArgParser *this)

{
  allocator<char> local_29c;
  allocator<char> local_29b;
  allocator<char> local_29a;
  allocator<char> local_299;
  string local_298;
  string local_278;
  string local_258;
  char *choices [4];
  string local_218;
  bare_arg_handler_t local_1f8;
  bare_arg_handler_t local_1d8;
  param_arg_handler_t local_1b8;
  param_arg_handler_t local_198;
  param_arg_handler_t local_178;
  bare_arg_handler_t local_158;
  _Any_data local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  bare_arg_handler_t local_70;
  param_arg_handler_t local_50;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)choices,"potato",(allocator<char> *)&local_298);
  QPDFArgParser::bindBare<ArgParser>(&local_158,(QPDFArgParser *)handlePotato,0,this);
  QPDFArgParser::addBare(&this->ap,(string *)choices,&local_158);
  std::_Function_base::~_Function_base(&local_158.super__Function_base);
  std::__cxx11::string::~string((string *)choices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)choices,"salad",(allocator<char> *)&local_298);
  QPDFArgParser::bindParam<ArgParser>(&local_178,(QPDFArgParser *)handleSalad,0,this);
  QPDFArgParser::addRequiredParameter(&this->ap,(string *)choices,&local_178,"tossed");
  std::_Function_base::~_Function_base(&local_178.super__Function_base);
  std::__cxx11::string::~string((string *)choices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)choices,"moo",(allocator<char> *)&local_298);
  QPDFArgParser::bindParam<ArgParser>(&local_198,(QPDFArgParser *)handleMoo,0,this);
  QPDFArgParser::addOptionalParameter(&this->ap,(string *)choices,&local_198);
  std::_Function_base::~_Function_base(&local_198.super__Function_base);
  std::__cxx11::string::~string((string *)choices);
  choices[2] = "sow";
  choices[3] = (char *)0x0;
  choices[0] = "pig";
  choices[1] = "boar";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"oink",(allocator<char> *)&local_278);
  QPDFArgParser::bindParam<ArgParser>(&local_1b8,(QPDFArgParser *)handleOink,0,this);
  QPDFArgParser::addChoices(&this->ap,&local_298,&local_1b8,true,choices);
  std::_Function_base::~_Function_base(&local_1b8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_298);
  QPDFArgParser::selectHelpOptionTable(&this->ap);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"version",(allocator<char> *)&local_278);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:54:27)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:54:27)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_298,(bare_arg_handler_t *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  std::__cxx11::string::~string((string *)&local_298);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"quack",(allocator<char> *)&local_278);
  QPDFArgParser::bindBare<ArgParser>(&local_1d8,(QPDFArgParser *)startQuack,0,this);
  QPDFArgParser::addBare(&this->ap,&local_298,&local_1d8);
  std::_Function_base::~_Function_base(&local_1d8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"quack",(allocator<char> *)&local_278);
  QPDFArgParser::bindBare<ArgParser>(&local_1f8,(QPDFArgParser *)endQuack,0,this);
  QPDFArgParser::registerOptionTable(&this->ap,&local_298,&local_1f8);
  std::_Function_base::~_Function_base(&local_1f8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_298);
  QPDFArgParser::bindParam<ArgParser>(&local_50,(QPDFArgParser *)getQuack,0,this);
  QPDFArgParser::addPositional(&this->ap,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  QPDFArgParser::bindBare<ArgParser>(&local_70,(QPDFArgParser *)finalChecks,0,this);
  QPDFArgParser::addFinalCheck(&this->ap,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"baaa",(allocator<char> *)&local_278);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:61:24)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:61:24)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_298,(bare_arg_handler_t *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"baaa",(allocator<char> *)&local_278);
  local_108 = 0;
  uStack_100 = 0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  QPDFArgParser::registerOptionTable(&this->ap,&local_298,(bare_arg_handler_t *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"ewe",(allocator<char> *)&local_278);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:63:23)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:63:23)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_298,(bare_arg_handler_t *)&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"ram",(allocator<char> *)&local_278);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:64:23)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:64:23)>
             ::_M_manager;
  local_d0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_298,(bare_arg_handler_t *)&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  std::__cxx11::string::~string((string *)&local_298);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"sheep",(allocator<char> *)&local_278);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:66:25)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:66:25)>
             ::_M_manager;
  local_f0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_298,(bare_arg_handler_t *)&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"sheep",(allocator<char> *)&local_278);
  local_128 = 0;
  uStack_120 = 0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  QPDFArgParser::registerOptionTable(&this->ap,&local_298,(bare_arg_handler_t *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"For more help, read the manual.\n",(allocator<char> *)&local_278)
  ;
  QPDFArgParser::addHelpFooter(&this->ap,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"quack",(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Quack Options",&local_29b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Just put stuff after quack to get a count at the end.\n",
             &local_29c);
  QPDFArgParser::addHelpTopic(&this->ap,&local_298,&local_278,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"baaa",(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Baaa Options",&local_29b)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Ewe can do sheepish things.\nFor example, ewe can add more ram to your computer.\n",
             &local_29c);
  QPDFArgParser::addHelpTopic(&this->ap,&local_298,&local_278,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"--ewe",&local_29b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"baaa",&local_29c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"just for ewe",&local_299)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"You are not a ewe.\n",&local_29a);
  QPDFArgParser::addOptionHelp(&this->ap,&local_298,&local_278,&local_258,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"--ram",&local_29b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"baaa",&local_29c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"curly horns",&local_299);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_29a);
  QPDFArgParser::addOptionHelp(&this->ap,&local_298,&local_278,&local_258,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  return;
}

Assistant:

void
ArgParser::initOptions()
{
    auto b = [this](void (ArgParser::*f)()) { return QPDFArgParser::bindBare(f, this); };
    auto p = [this](void (ArgParser::*f)(std::string const&)) {
        return QPDFArgParser::bindParam(f, this);
    };

    ap.addBare("potato", b(&ArgParser::handlePotato));
    ap.addRequiredParameter("salad", p(&ArgParser::handleSalad), "tossed");
    ap.addOptionalParameter("moo", p(&ArgParser::handleMoo));
    char const* choices[] = {"pig", "boar", "sow", nullptr};
    ap.addChoices("oink", p(&ArgParser::handleOink), true, choices);
    ap.selectHelpOptionTable();
    ap.addBare("version", [this]() { output("3.14159"); });
    ap.selectMainOptionTable();
    ap.addBare("quack", b(&ArgParser::startQuack));
    ap.registerOptionTable("quack", b(&ArgParser::endQuack));
    ap.addPositional(p(&ArgParser::getQuack));
    ap.addFinalCheck(b(&ArgParser::finalChecks));
    ap.selectMainOptionTable();
    ap.addBare("baaa", [this]() { this->ap.selectOptionTable("baaa"); });
    ap.registerOptionTable("baaa", nullptr);
    ap.addBare("ewe", [this]() { output("you"); });
    ap.addBare("ram", [this]() { output("ram"); });
    ap.selectMainOptionTable();
    ap.addBare("sheep", [this]() { this->ap.selectOptionTable("sheep"); });
    ap.registerOptionTable("sheep", nullptr);

    ap.addHelpFooter("For more help, read the manual.\n");
    ap.addHelpTopic(
        "quack", "Quack Options", "Just put stuff after quack to get a count at the end.\n");
    ap.addHelpTopic(
        "baaa",
        "Baaa Options",
        "Ewe can do sheepish things.\n"
        "For example, ewe can add more ram to your computer.\n");
    ap.addOptionHelp("--ewe", "baaa", "just for ewe", "You are not a ewe.\n");
    ap.addOptionHelp("--ram", "baaa", "curly horns", "");
}